

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O0

void __thiscall cppnet::BaseLogger::~BaseLogger(BaseLogger *this)

{
  BaseLogger *this_local;
  
  SetLevel(this,LL_NULL);
  std::shared_ptr<cppnet::Logger>::~shared_ptr(&this->_logger);
  ThreadSafeQueue<cppnet::Log_*>::~ThreadSafeQueue(&this->_cache_queue);
  std::shared_ptr<cppnet::Alloter>::~shared_ptr(&this->_allocter);
  return;
}

Assistant:

BaseLogger::~BaseLogger() {
    SetLevel(LL_NULL);
}